

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

float * stbi_loadf_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  float *pfVar2;
  stbi_uc *data;
  stbi local_50;
  
  iVar1 = stbi_hdr_test_file(f);
  if (iVar1 == 0) {
    data = stbi_load_from_file(f,x,y,comp,req_comp);
    if (data != (stbi_uc *)0x0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar2 = ldr_to_hdr(data,*x,*y,req_comp);
      return pfVar2;
    }
    failure_reason = "Image not of any known type, or corrupt";
    pfVar2 = (float *)0x0;
  }
  else {
    local_50.img_file = f;
    pfVar2 = hdr_load(&local_50,x,y,comp,req_comp);
  }
  return pfVar2;
}

Assistant:

float *stbi_loadf_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi_hdr_test_file(f))
      return stbi_hdr_load_from_file(f,x,y,comp,req_comp);
   #endif
   data = stbi_load_from_file(f, x, y, comp, req_comp);
   if (data)
      return ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return epf("unknown image type", "Image not of any known type, or corrupt");
}